

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDirectoryInformationFile(cmLocalUnixMakefileGenerator3 *this)

{
  Snapshot *this_00;
  char *pcVar1;
  size_t sVar2;
  string infoFileName;
  cmGeneratedFileStream infoFileStream;
  undefined1 auStack_2d8 [8];
  long *local_2d0 [2];
  long local_2c0 [2];
  undefined1 local_2b0 [584];
  Directory local_68;
  Directory local_40;
  
  pcVar1 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)local_2d0,pcVar1,(allocator *)local_2b0);
  std::__cxx11::string::append((char *)local_2d0);
  std::__cxx11::string::append((char *)local_2d0);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2b0,(char *)local_2d0[0],false);
  if (((byte)(*(_func_int **)(local_2b0._0_8_ + -0x18))[(long)(local_2b0 + 0x20)] & 5) == 0) {
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_2b0,true);
    WriteDisclaimer(this,(ostream *)local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2b0,"# Relative path conversion top directories.\n",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2b0,"set(CMAKE_RELATIVE_PATH_TOP_SOURCE \"",0x24);
    this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot;
    cmState::Snapshot::GetDirectory(&local_40,this_00);
    pcVar1 = cmState::Directory::GetRelativePathTopSource(&local_40);
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)auStack_2d8 + (int)*(_func_int **)(local_2b0._0_8_ + -0x18) + 0x28);
    }
    else {
      sVar2 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar1,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"\")\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2b0,"set(CMAKE_RELATIVE_PATH_TOP_BINARY \"",0x24);
    cmState::Snapshot::GetDirectory(&local_68,this_00);
    pcVar1 = cmState::Directory::GetRelativePathTopBinary(&local_68);
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)auStack_2d8 + (int)*(_func_int **)(local_2b0._0_8_ + -0x18) + 0x28);
    }
    else {
      sVar2 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,pcVar1,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"\")\n",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"\n",1);
    if (cmSystemTools::s_ForceUnixPaths == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2b0,"# Force unix paths in dependencies.\n",0x24);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2b0,"set(CMAKE_FORCE_UNIX_PATHS 1)\n",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2b0,"# The C and CXX include file regular expressions for ",0x35);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2b0,"this directory.\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2b0,"set(CMAKE_C_INCLUDE_REGEX_SCAN ",0x1f);
    pcVar1 = cmMakefile::GetIncludeRegularExpression
                       ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile);
    WriteCMakeArgument((ostream *)local_2b0,pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2b0,"set(CMAKE_C_INCLUDE_REGEX_COMPLAIN ",0x23);
    WriteCMakeArgument((ostream *)local_2b0,
                       (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile)->
                       ComplainFileRegularExpression)._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2b0,
               "set(CMAKE_CXX_INCLUDE_REGEX_SCAN ${CMAKE_C_INCLUDE_REGEX_SCAN})\n",0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2b0,
               "set(CMAKE_CXX_INCLUDE_REGEX_COMPLAIN ${CMAKE_C_INCLUDE_REGEX_COMPLAIN})\n",0x48);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2b0);
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0],local_2c0[0] + 1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteDirectoryInformationFile()
{
  std::string infoFileName = this->GetCurrentBinaryDirectory();
  infoFileName += cmake::GetCMakeFilesDirectory();
  infoFileName += "/CMakeDirectoryInformation.cmake";

  // Open the output file.
  cmGeneratedFileStream infoFileStream(infoFileName.c_str());
  if(!infoFileStream)
    {
    return;
    }

  infoFileStream.SetCopyIfDifferent(true);
  // Write the do not edit header.
  this->WriteDisclaimer(infoFileStream);

  // Setup relative path conversion tops.
  infoFileStream
    << "# Relative path conversion top directories.\n"
    << "set(CMAKE_RELATIVE_PATH_TOP_SOURCE \""
    << this->StateSnapshot.GetDirectory().GetRelativePathTopSource()
    << "\")\n"
    << "set(CMAKE_RELATIVE_PATH_TOP_BINARY \""
    << this->StateSnapshot.GetDirectory().GetRelativePathTopBinary()
    << "\")\n"
    << "\n";

  // Tell the dependency scanner to use unix paths if necessary.
  if(cmSystemTools::GetForceUnixPaths())
    {
    infoFileStream
      << "# Force unix paths in dependencies.\n"
      << "set(CMAKE_FORCE_UNIX_PATHS 1)\n"
      << "\n";
    }

  // Store the include regular expressions for this directory.
  infoFileStream
    << "\n"
    << "# The C and CXX include file regular expressions for "
    << "this directory.\n";
  infoFileStream
    << "set(CMAKE_C_INCLUDE_REGEX_SCAN ";
  this->WriteCMakeArgument(infoFileStream,
                           this->Makefile->GetIncludeRegularExpression());
  infoFileStream
    << ")\n";
  infoFileStream
    << "set(CMAKE_C_INCLUDE_REGEX_COMPLAIN ";
  this->WriteCMakeArgument(infoFileStream,
                           this->Makefile->GetComplainRegularExpression());
  infoFileStream
    << ")\n";
  infoFileStream
    << "set(CMAKE_CXX_INCLUDE_REGEX_SCAN ${CMAKE_C_INCLUDE_REGEX_SCAN})\n";
  infoFileStream
    << "set(CMAKE_CXX_INCLUDE_REGEX_COMPLAIN "
    "${CMAKE_C_INCLUDE_REGEX_COMPLAIN})\n";
}